

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O0

Scalar __thiscall
Eigen::DenseBase<Eigen::Diagonal<Eigen::Matrix<float,3,3,0,3,3>const,0>>::
redux<Eigen::internal::scalar_sum_op<float,float>>
          (DenseBase<Eigen::Diagonal<Eigen::Matrix<float,3,3,0,3,3>const,0>> *this,
          scalar_sum_op<float,_float> *func)

{
  bool bVar1;
  undefined8 func_00;
  Index IVar2;
  Diagonal<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> *pDVar3;
  Scalar SVar4;
  undefined1 local_28 [8];
  ThisEvaluator thisEval;
  scalar_sum_op<float,_float> *func_local;
  DenseBase<Eigen::Diagonal<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_> *this_local;
  
  thisEval.super_evaluator<Eigen::Diagonal<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>._8_8_ =
       func;
  IVar2 = EigenBase<Eigen::Diagonal<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>::rows
                    ((EigenBase<Eigen::Diagonal<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_> *)
                     this);
  bVar1 = false;
  if (0 < IVar2) {
    IVar2 = EigenBase<Eigen::Diagonal<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>::cols
                      ((EigenBase<Eigen::Diagonal<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_> *)
                       this);
    bVar1 = false;
    if (0 < IVar2) {
      bVar1 = true;
    }
  }
  if (!bVar1) {
    __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Redux.h"
                  ,0x19b,
                  "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::Diagonal<const Eigen::Matrix<float, 3, 3>>>::redux(const Func &) const [Derived = Eigen::Diagonal<const Eigen::Matrix<float, 3, 3>>, BinaryOp = Eigen::internal::scalar_sum_op<float>]"
                 );
  }
  pDVar3 = EigenBase<Eigen::Diagonal<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>::derived
                     ((EigenBase<Eigen::Diagonal<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_> *)
                      this);
  internal::redux_evaluator<Eigen::Diagonal<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>::
  redux_evaluator((redux_evaluator<Eigen::Diagonal<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_> *
                  )local_28,pDVar3);
  func_00 = thisEval.super_evaluator<Eigen::Diagonal<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>
            ._8_8_;
  pDVar3 = EigenBase<Eigen::Diagonal<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>::derived
                     ((EigenBase<Eigen::Diagonal<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_> *)
                      this);
  SVar4 = internal::
          redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::Diagonal<Eigen::Matrix<float,3,3,0,3,3>const,0>>,0,2>
          ::run<Eigen::Diagonal<Eigen::Matrix<float,3,3,0,3,3>const,0>>
                    ((redux_evaluator<Eigen::Diagonal<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>
                      *)local_28,(scalar_sum_op<float,_float> *)func_00,pDVar3);
  internal::redux_evaluator<Eigen::Diagonal<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>::
  ~redux_evaluator((redux_evaluator<Eigen::Diagonal<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>
                    *)local_28);
  return SVar4;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE typename internal::traits<Derived>::Scalar
DenseBase<Derived>::redux(const Func& func) const
{
  eigen_assert(this->rows()>0 && this->cols()>0 && "you are using an empty matrix");

  typedef typename internal::redux_evaluator<Derived> ThisEvaluator;
  ThisEvaluator thisEval(derived());

  // The initial expression is passed to the reducer as an additional argument instead of
  // passing it as a member of redux_evaluator to help  
  return internal::redux_impl<Func, ThisEvaluator>::run(thisEval, func, derived());
}